

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O1

void ObserverManager::subscribe<FooBarProtocol,B>(B *observer)

{
  mapped_type *pp_Var1;
  __node_gen_type __node_gen;
  
  if (observer != (B *)0x0) {
    pp_Var1 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&unsubscribeMap,
                           &(observer->super_FooBarProtocol).super_BaseObserverProtocol.observerId);
    *pp_Var1 = ObserverContainer<FooBarProtocol>::removeObserver;
    std::
    _Hashtable<FooBarProtocol*,FooBarProtocol*,std::allocator<FooBarProtocol*>,std::__detail::_Identity,std::equal_to<FooBarProtocol*>,std::hash<FooBarProtocol*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<FooBarProtocol*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<FooBarProtocol*,false>>>>
              ();
  }
  return;
}

Assistant:

static void subscribe(O* observer) {
        static_assert(std::is_base_of<BaseObserverProtocol, O>::value,
                      "All observers must inherit from BaseObserverProtocol");
        if (observer == nullptr) {
            return;
        }

        unsubscribeMap[observer->P::observerId] = &ObserverContainer<P>::removeObserver;
        ObserverContainer<P>::addObserver(observer);
    }